

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.cpp
# Opt level: O2

path * GetPidFile(path *__return_storage_ptr__,ArgsManager *args)

{
  long in_FS_OFFSET;
  string in_stack_ffffffffffffff68;
  undefined1 local_60 [72];
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_60,"-pid",(allocator<char> *)&stack0xffffffffffffff77);
  fs::path::path((path *)&stack0xffffffffffffff78,BITCOIN_PID_FILENAME);
  ArgsManager::GetPathArg((path *)(local_60 + 0x20),args,in_stack_ffffffffffffff68,(path *)local_60)
  ;
  AbsPathForConfigVal(__return_storage_ptr__,args,(path *)(local_60 + 0x20),true);
  std::filesystem::__cxx11::path::~path((path *)(local_60 + 0x20));
  std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffff78);
  std::__cxx11::string::~string((string *)local_60);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

static fs::path GetPidFile(const ArgsManager& args)
{
    return AbsPathForConfigVal(args, args.GetPathArg("-pid", BITCOIN_PID_FILENAME));
}